

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs.cpp
# Opt level: O0

CBString * guidToUString(CBString *__return_storage_ptr__,EFI_GUID *guid,bool convertToString)

{
  bool bVar1;
  bool convertToString_local;
  EFI_GUID *guid_local;
  CBString *readableName;
  
  if (convertToString) {
    guidDatabaseLookup(__return_storage_ptr__,guid);
    bVar1 = Bstrlib::CBString::isEmpty(__return_storage_ptr__);
    if (!bVar1) {
      return __return_storage_ptr__;
    }
    Bstrlib::CBString::~CBString(__return_storage_ptr__);
  }
  usprintf(__return_storage_ptr__,"%08X-%04X-%04X-%02X%02X-%02X%02X%02X%02X%02X%02X",
           (ulong)guid->Data1,(ulong)guid->Data2,(ulong)guid->Data3,(ulong)guid->Data4[0],
           (uint)guid->Data4[1],(uint)guid->Data4[2],(uint)guid->Data4[3],(uint)guid->Data4[4],
           (uint)guid->Data4[5],(uint)guid->Data4[6],(uint)guid->Data4[7]);
  return __return_storage_ptr__;
}

Assistant:

UString guidToUString(const EFI_GUID & guid, bool convertToString)
{
    if (convertToString) {
        UString readableName = guidDatabaseLookup(guid);
        if (!readableName.isEmpty())
            return readableName;
    }
    
    return usprintf("%08X-%04X-%04X-%02X%02X-%02X%02X%02X%02X%02X%02X",
                    guid.Data1,
                    guid.Data2,
                    guid.Data3,
                    guid.Data4[0],
                    guid.Data4[1],
                    guid.Data4[2],
                    guid.Data4[3],
                    guid.Data4[4],
                    guid.Data4[5],
                    guid.Data4[6],
                    guid.Data4[7]);
}